

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O0

bool __thiscall ValueInfo::IsIntBounded(ValueInfo *this)

{
  code *pcVar1;
  bool bVar2;
  IntBounds *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar3;
  undefined4 *puVar4;
  bool bVar5;
  bool isIntBounded;
  ValueInfo *this_local;
  
  bVar2 = ValueType::IsLikelyInt(&this->super_ValueType);
  bVar5 = false;
  if (bVar2) {
    bVar5 = this->structureKind == IntBounded;
  }
  if (bVar5) {
    this_00 = IntBoundedValueInfo::Bounds((IntBoundedValueInfo *)this);
    paVar3 = &Type(this)->field_0;
    bVar2 = IntBounds::RequiresIntBoundedValueInfo
                      (this_00,(ValueType)
                               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar3->field_0);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.cpp"
                         ,0x1d5,
                         "(!isIntBounded || static_cast<const IntBoundedValueInfo *>(this)->Bounds()->RequiresIntBoundedValueInfo(Type()))"
                         ,
                         "!isIntBounded || static_cast<const IntBoundedValueInfo *>(this)->Bounds()->RequiresIntBoundedValueInfo(Type())"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return bVar5;
}

Assistant:

bool
ValueInfo::IsIntBounded() const
{
    const bool isIntBounded = IsLikelyInt() && structureKind == ValueStructureKind::IntBounded;

    // Bounds for definitely int values should have relative bounds, otherwise those values should use one of the other value
    // infos
    Assert(!isIntBounded || static_cast<const IntBoundedValueInfo *>(this)->Bounds()->RequiresIntBoundedValueInfo(Type()));

    return isIntBounded;
}